

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

NBestSentencePieceText *
google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NBestSentencePieceText>(Arena *arena)

{
  NBestSentencePieceText *this;
  
  if (arena == (Arena *)0x0) {
    this = (NBestSentencePieceText *)operator_new(0x30);
    sentencepiece::NBestSentencePieceText::NBestSentencePieceText(this);
  }
  else {
    internal::ArenaImpl::RecordAlloc
              ((ArenaImpl *)arena,(type_info *)&sentencepiece::NBestSentencePieceText::typeinfo,0x30
              );
    this = (NBestSentencePieceText *)AllocateAlignedNoHook(arena,0x30);
    sentencepiece::NBestSentencePieceText::NBestSentencePieceText(this,arena);
  }
  return this;
}

Assistant:

SentencePieceText::SentencePieceText(const SentencePieceText& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      _has_bits_(from._has_bits_),
      pieces_(from.pieces_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  text_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_text()) {
    text_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_text(), 
      GetArena());
  }
  score_ = from.score_;
  // @@protoc_insertion_point(copy_constructor:sentencepiece.SentencePieceText)
}